

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_create_function16
              (sqlite3 *db,void *zFunctionName,int nArg,int eTextRep,void *p,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
              _func_void_sqlite3_context_ptr *xFinal)

{
  int iVar1;
  char *zFunctionName_00;
  u8 enc;
  
  enc = (u8)eTextRep;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  zFunctionName_00 = sqlite3Utf16to8(db,zFunctionName,-1,enc);
  iVar1 = sqlite3CreateFunc(db,zFunctionName_00,nArg,eTextRep,p,xFunc,xStep,xFinal,
                            (FuncDestructor *)0x0);
  sqlite3DbFree(db,zFunctionName_00);
  iVar1 = sqlite3ApiExit(db,iVar1);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_create_function16(
  sqlite3 *db,
  const void *zFunctionName,
  int nArg,
  int eTextRep,
  void *p,
  void (*xFunc)(sqlite3_context*,int,sqlite3_value**),
  void (*xStep)(sqlite3_context*,int,sqlite3_value**),
  void (*xFinal)(sqlite3_context*)
){
  int rc;
  char *zFunc8;
  sqlite3_mutex_enter(db->mutex);
  assert( !db->mallocFailed );
  zFunc8 = sqlite3Utf16to8(db, zFunctionName, -1, SQLITE_UTF16NATIVE);
  rc = sqlite3CreateFunc(db, zFunc8, nArg, eTextRep, p, xFunc, xStep, xFinal,0);
  sqlite3DbFree(db, zFunc8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}